

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::GreaterThanEqualTest<short,unsigned_int>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2a;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_28;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_26;
  int local_24;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  int local_1c [3];
  
  local_1c[2] = 3;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_26,local_1c + 2);
  if (local_26.m_int < 3) {
    local_1c[1] = 4;
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_28,local_1c + 1);
    if (4 < local_28.m_int) {
      local_1c[0] = 6;
      SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_2a,local_1c);
      local_24 = 7;
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_20,&local_24);
      return (long)(ulong)local_20.m_int <= (long)local_2a.m_int;
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool GreaterThanEqualTest()
	{
		return
			(U)2 >= SafeInt<T>(3) &&
			SafeInt<T>(4) >= (U)5 &&
			SafeInt<T>(6) >= SafeInt<U>(7);
	}